

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
SetPropertyFromDescriptor<false,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  PropertyRecord **ppPVar9;
  PropertyRecord *pPVar10;
  UndeclaredBlockVariable *pUVar11;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *pSVar12;
  PropertyRecord *pPVar13;
  ulong uVar14;
  _func_int *UNRECOVERED_JUMPTABLE;
  int local_5c;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_58;
  int propertyIndex;
  Var local_50;
  DynamicObject *local_48;
  ScriptContext *local_40;
  PropertyOperationFlags local_38;
  uint local_34;
  
  local_38 = flags;
  local_50 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = instance;
    local_34 = propertyId;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar3) goto LAB_00cad4ea;
    *puVar8 = 0;
    instance = local_48;
    propertyId = local_34;
  }
  bVar4 = descriptor->Attributes;
  if ((bVar4 & 0x10) != 0) {
    pSVar12 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
              SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
              ConvertToDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                         this,instance);
    UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
    uVar14 = (ulong)(uint)propertyId;
LAB_00cacfa7:
    iVar6 = (*UNRECOVERED_JUMPTABLE)(pSVar12,instance,uVar14,local_50,(ulong)local_38,info);
    return iVar6;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  local_40 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((bVar4 & 8) == 0) {
    if ((local_38 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar4 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_38,local_40);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar12 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *
                           )this,instance);
      UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
      uVar14 = (ulong)(uint)propertyKey;
      goto LAB_00cacfa7;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_48 = instance;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar3) goto LAB_00cad4ea;
        *puVar8 = 0;
        instance = local_48;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((local_38 & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          ((DynamicTypeHandler *)this,local_40,
                           (local_38 &
                           (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
                           PropertyOperation_None), !bVar3)) {
      return 0;
    }
    pSStack_58 = descriptor;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar3 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>
                                     *)this,instance,descriptor->propertyIndex,&local_5c), bVar3)) {
      ppPVar9 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                             **)(this + 0x18),local_5c);
      pPVar13 = *ppPVar9;
      pPVar10 = ScriptContext::GetPropertyName(local_40,propertyKey);
      if (pPVar13 != pPVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar3) goto LAB_00cad4ea;
        *puVar8 = 0;
      }
      pSStack_58 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),local_5c);
    }
    bVar3 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                       this,local_40);
    if (bVar3) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>)
                   ((char)this[0x29] + -1);
    }
    pSStack_58->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != -1) {
      ScriptContext::InvalidateProtoCaches(local_40,propertyKey);
    }
    pSStack_58->Attributes = '\a';
    bVar4 = 7;
    descriptor = pSStack_58;
    propertyId = propertyKey;
  }
  if (descriptor->propertyIndex == -1) goto LAB_00cad466;
  local_34 = propertyId;
  if (((-1 < (char)(undefined1)local_38 && 0x3f < bVar4) &&
      (pUVar11 = (UndeclaredBlockVariable *)
                 DynamicObject::GetSlot(instance,descriptor->propertyIndex),
      (local_38 >> 8 & 1) == 0)) &&
     ((((local_40->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      pUVar11)) {
    JavascriptError::ThrowReferenceError(local_40,-0x7ff5ec07,(PCWSTR)0x0);
  }
  if (*(long **)(this + 0x20) == (long *)0x0) {
    bVar3 = false;
  }
  else if ((DynamicObject *)**(long **)(this + 0x20) == instance) {
    bVar3 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    pSStack_58 = descriptor;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar3) goto LAB_00cad4ea;
    *puVar8 = 0;
    bVar3 = false;
    descriptor = pSStack_58;
  }
  if ((*(byte *)descriptor & 2) == 0) {
    if ((((local_38 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)descriptor = *(byte *)descriptor | 2, bVar3)) &&
       ((local_38 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyKey)) {
      local_48 = instance;
      if (((byte)this[9] & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar3) goto LAB_00cad4ea;
        *puVar8 = 0;
      }
      if (local_50 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar3) goto LAB_00cad4ea;
        *puVar8 = 0;
      }
      instance = local_48;
      BVar7 = RecyclableObject::IsExternal(&local_48->super_RecyclableObject);
      if (BVar7 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar3) {
LAB_00cad4ea:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
        instance = local_48;
      }
      bVar3 = VarIs<Js::JavascriptFunction>(local_50);
      if (bVar3) {
        bVar3 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00cad4bb:
        bVar4 = *(byte *)descriptor;
        if (bVar3 == false) goto LAB_00cad4d4;
        bVar5 = 4;
      }
      else {
        bVar3 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar3) {
          bVar3 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,local_50);
          goto LAB_00cad4bb;
        }
        bVar4 = *(byte *)descriptor;
LAB_00cad4d4:
        bVar5 = 0;
      }
      *(byte *)descriptor = bVar4 & 0xfb | bVar5;
    }
  }
  else {
    pPVar13 = ScriptContext::GetPropertyName(local_40,propertyKey);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar13,descriptor,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  propertyId = local_34;
  DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,local_50);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00cad466:
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(propertyId,propertyKey);
  if (propertyKey != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,local_50,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }